

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Mprobe(int source,int tag,MPIABI_Comm comm,MPIABI_Message *message,MPIABI_Status *status)

{
  int iVar1;
  ompi_communicator_t *poVar2;
  ompi_message_t **ppoVar3;
  MPI_Status *pMVar4;
  WPI_StatusPtr local_50 [3];
  WPI_HandlePtr<ompi_message_t_*> local_38;
  WPI_Handle local_30 [8];
  MPIABI_Status *local_28;
  MPIABI_Status *status_local;
  MPIABI_Message *message_local;
  MPIABI_Comm comm_local;
  int tag_local;
  int source_local;
  
  local_28 = status;
  status_local = (MPIABI_Status *)message;
  message_local = (MPIABI_Message *)comm;
  comm_local._0_4_ = tag;
  comm_local._4_4_ = source;
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle((WPI_Handle<ompi_communicator_t_*> *)local_30,comm);
  poVar2 = WPI_Handle::operator_cast_to_ompi_communicator_t_(local_30);
  WPI_HandlePtr<ompi_message_t_*>::WPI_HandlePtr(&local_38,(uintptr_t *)status_local);
  ppoVar3 = WPI_HandlePtr::operator_cast_to_ompi_message_t__((WPI_HandlePtr *)&local_38);
  WPI_StatusPtr::WPI_StatusPtr(local_50,local_28);
  pMVar4 = WPI_StatusPtr::operator_cast_to_ompi_status_public_t_(local_50);
  iVar1 = MPI_Mprobe(source,tag,poVar2,ppoVar3,pMVar4);
  WPI_StatusPtr::~WPI_StatusPtr(local_50);
  WPI_HandlePtr<ompi_message_t_*>::~WPI_HandlePtr(&local_38);
  return iVar1;
}

Assistant:

int MPIABI_Mprobe(
  int source,
  int tag,
  MPIABI_Comm comm,
  MPIABI_Message * message,
  MPIABI_Status * status
) {
  return MPI_Mprobe(
    source,
    tag,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Message *)(WPI_MessagePtr)message,
    (MPI_Status *)(WPI_StatusPtr)status
  );
}